

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

u32 utilNonce32(void)

{
  u32 uVar1;
  u32 state;
  tm_ticks_t curticks;
  tm_time_t curtime;
  tm_ticks_t local_10;
  tm_time_t local_8;
  
  local_8 = tmTime();
  uVar1 = utilFNV32(&local_8,8,0x811c9dc5);
  local_10 = tmTicks();
  uVar1 = utilFNV32(&local_10,8,uVar1);
  return uVar1;
}

Assistant:

u32 utilNonce32()
{
	tm_time_t curtime;
	tm_ticks_t curticks;
	register u32 state = 2166136261u;
	// UNIX-время
	curtime = tmTime();
	state = utilFNV32(&curtime, sizeof(curtime), state);
	// число тактов
	curticks = tmTicks();
	state = utilFNV32(&curticks, sizeof(curticks), state);
	// еще?
	return state;
}